

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

IdentifierNameSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::IdentifierNameSyntax,slang::parsing::Token&>
          (BumpAllocator *this,Token *args)

{
  Token identifier;
  IdentifierNameSyntax *this_00;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (IdentifierNameSyntax *)allocate(this,0x20,8);
  identifier.kind = args->kind;
  identifier._2_1_ = args->field_0x2;
  identifier.numFlags.raw = (args->numFlags).raw;
  identifier.rawLen = args->rawLen;
  identifier.info = args->info;
  slang::syntax::IdentifierNameSyntax::IdentifierNameSyntax(this_00,identifier);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }